

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O1

int pospopcnt_u16_avx512bw_blend_popcnt_unroll4(uint16_t *data,uint32_t len,uint32_t *flags)

{
  int *piVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  
  uVar2 = (ulong)(len >> 5);
  if (len < 0x80) {
    uVar5 = 0;
  }
  else {
    auVar12 = vpbroadcastd_avx512f(ZEXT416(0xff00ff));
    auVar13 = vpbroadcastd_avx512f(ZEXT416(0xff00ff00));
    uVar4 = 0;
    uVar3 = 4;
    do {
      uVar5 = uVar3;
      auVar14 = vmovdqu64_avx512f(*(undefined1 (*) [64])(data + uVar4 * 0x20));
      auVar15 = vmovdqu64_avx512f(*(undefined1 (*) [64])(data + uVar4 * 0x20 + 0x20));
      auVar16 = vmovdqu64_avx512f(*(undefined1 (*) [64])(data + uVar4 * 0x20 + 0x40));
      auVar10 = vmovdqu64_avx512f(*(undefined1 (*) [64])(data + uVar4 * 0x20 + 0x60));
      auVar11 = vpsllw_avx512bw(auVar15,8);
      auVar11 = vpternlogd_avx512f(auVar11,auVar12,auVar14,0xf8);
      auVar15 = vpsrlw_avx512bw(auVar15,8);
      auVar14 = vpternlogd_avx512f(auVar15,auVar13,auVar14,0xf8);
      auVar15 = vpsllw_avx512bw(auVar10,8);
      auVar15 = vpternlogd_avx512f(auVar15,auVar12,auVar16,0xf8);
      auVar10 = vpsrlw_avx512bw(auVar10,8);
      auVar16 = vpternlogd_avx512f(auVar10,auVar13,auVar16,0xf8);
      lVar6 = 0x20;
      do {
        uVar9 = vpmovb2m_avx512bw(auVar11);
        uVar7 = vpmovb2m_avx512bw(auVar14);
        uVar8 = vpmovb2m_avx512bw(auVar15);
        *(int *)((long)flags + lVar6 + -4) =
             (int)POPCOUNT(uVar8) + (int)POPCOUNT(uVar9) + *(int *)((long)flags + lVar6 + -4);
        uVar9 = vpmovb2m_avx512bw(auVar16);
        *(int *)((long)flags + lVar6 + 0x1c) =
             (int)POPCOUNT(uVar9) + (int)POPCOUNT(uVar7) + *(int *)((long)flags + lVar6 + 0x1c);
        auVar11 = vpaddb_avx512bw(auVar11,auVar11);
        auVar14 = vpaddb_avx512bw(auVar14,auVar14);
        auVar15 = vpaddb_avx512bw(auVar15,auVar15);
        auVar16 = vpaddb_avx512bw(auVar16,auVar16);
        lVar6 = lVar6 + -4;
      } while (lVar6 != 0);
      uVar4 = uVar5;
      uVar3 = uVar5 + 4;
    } while (uVar5 + 4 <= uVar2);
  }
  if ((uVar5 | 2) <= uVar2) {
    auVar12 = vpbroadcastd_avx512f(ZEXT416(0xff00ff));
    auVar13 = vpbroadcastd_avx512f(ZEXT416(0xff00ff00));
    uVar4 = uVar5;
    uVar3 = uVar5 | 2;
    do {
      uVar5 = uVar3;
      auVar14 = vmovdqu64_avx512f(*(undefined1 (*) [64])(data + uVar4 * 0x20));
      auVar15 = vmovdqu64_avx512f(*(undefined1 (*) [64])(data + uVar4 * 0x20 + 0x20));
      auVar16 = vpsllw_avx512bw(auVar15,8);
      auVar16 = vpternlogd_avx512f(auVar16,auVar14,auVar12,0xf8);
      auVar15 = vpsrlw_avx512bw(auVar15,8);
      auVar14 = vpternlogd_avx512f(auVar15,auVar14,auVar13,0xf8);
      lVar6 = 0x20;
      do {
        uVar9 = vpmovb2m_avx512bw(auVar16);
        piVar1 = (int *)((long)flags + lVar6 + -4);
        *piVar1 = *piVar1 + (int)POPCOUNT(uVar9);
        uVar9 = vpmovb2m_avx512bw(auVar14);
        piVar1 = (int *)((long)flags + lVar6 + 0x1c);
        *piVar1 = *piVar1 + (int)POPCOUNT(uVar9);
        auVar16 = vpaddb_avx512bw(auVar16,auVar16);
        auVar14 = vpaddb_avx512bw(auVar14,auVar14);
        lVar6 = lVar6 + -4;
      } while (lVar6 != 0);
      uVar4 = uVar5;
      uVar3 = uVar5 + 2;
    } while (uVar5 + 2 <= uVar2);
  }
  uVar5 = uVar5 << 5;
  if (uVar5 < len) {
    auVar12 = vmovdqu64_avx512f(*(undefined1 (*) [64])flags);
    auVar13 = vpmovsxbd_avx512f(_DAT_0011a080);
    auVar14 = vpbroadcastd_avx512f(ZEXT416(1));
    do {
      auVar15 = vpbroadcastd_avx512f();
      auVar15 = vpsrlvd_avx512f(auVar15,auVar13);
      auVar15 = vpandd_avx512f(auVar15,auVar14);
      auVar12 = vpaddd_avx512f(auVar15,auVar12);
      uVar5 = uVar5 + 1;
    } while (len != uVar5);
    auVar12 = vmovdqu64_avx512f(auVar12);
    *(undefined1 (*) [64])flags = auVar12;
  }
  return 0;
}

Assistant:

int pospopcnt_u16_avx512bw_blend_popcnt_unroll4(const uint16_t* data, uint32_t len, uint32_t* flags) { 
    const __m512i* data_vectors = (const __m512i*)(data);
    const uint32_t n_cycles = len / 32;

    size_t i = 0;
    for (/**/; i + 4 <= n_cycles; i += 4) {
#define L(p) __m512i v##p = _mm512_loadu_si512(data_vectors+i+p);
        L(0) L(1) L(2) L(3)

#define U0(p,k) __m512i input##p = _mm512_ternarylogic_epi32(v##p, _mm512_set1_epi16(0x00FF), _mm512_slli_epi16(v##k, 8), AND_OR);
#define U1(p,k) __m512i input##k = _mm512_ternarylogic_epi32(v##p, _mm512_set1_epi16((int16_t)0xFF00), _mm512_srli_epi16(v##k, 8), AND_OR);
#define U(p, k)  U0(p,k) U1(p,k)

        U(0,1) U(2,3)
        
        for (int i = 0; i < 8; ++i) {
#define A0(p) flags[ 7 - i] += _mm_popcnt_u64(_mm512_movepi8_mask(input##p));
#define A1(k) flags[15 - i] += _mm_popcnt_u64(_mm512_movepi8_mask(input##k));
#define A(p, k) A0(p) A1(k)
            A(0,1) A(2, 3)

#define P0(p) input##p = _mm512_add_epi8(input##p, input##p);
#define P(p, k) P0(p) P0(k)
            P(0,1) P(2, 3)
        }
    }

    for (/**/; i + 2 <= n_cycles; i += 2) {
        L(0) L(1)
        U(0,1)
        
        for (int i = 0; i < 8; ++i) {
            A(0,1)
            P(0,1)
        }
    }

    i *= 32;
    for (/**/; i < len; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += ((data[i] & (1 << j)) >> j);
        }
    }

#undef L
#undef U0
#undef U1
#undef U
#undef A0
#undef A1
#undef A
#undef P0
#undef P
    
    return 0;
}